

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O2

int executeLoadManifestCommand
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,bool loadOnly)

{
  int iVar1;
  pointer pbVar2;
  Rule *pRVar3;
  Command *pCVar4;
  undefined8 *puVar5;
  pointer pcVar6;
  size_type *psVar7;
  size_type sVar8;
  pointer ppNVar9;
  Pool *this;
  StringRef str;
  StringRef str_00;
  StringRef str_01;
  StringRef str_02;
  StringRef str_03;
  StringRef str_04;
  StringRef str_05;
  long *plVar10;
  StringRef filename_00;
  FILE *pFVar11;
  pointer ppRVar12;
  pointer ppCVar13;
  pointer ppVar14;
  iterator iVar15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  uint uVar19;
  char *pcVar20;
  pointer pbVar21;
  long lVar22;
  ostream *poVar23;
  ulong uVar24;
  pointer ppRVar25;
  pointer ppCVar26;
  int *piVar27;
  byte bVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_13;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *entry;
  string *psVar29;
  pointer ppNVar30;
  bool bVar31;
  Pool **pool;
  StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
  SVar32;
  undefined4 uVar33;
  undefined7 in_register_00000031;
  vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> *this_00;
  Node **node_2;
  __normal_iterator<llbuild::ninja::Pool_**,_std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>_>
  __i;
  pointer pbVar34;
  long lVar35;
  pointer ppVar36;
  pointer ppVar37;
  pointer ppRVar38;
  size_type sVar39;
  StringMapEntryBase **ppSVar40;
  pointer ppCVar41;
  error_code eVar42;
  undefined8 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 uVar43;
  vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> rules;
  vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> commands;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  bindings;
  iterator __begin2_1;
  iterator __begin2;
  StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
  SStack_190;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parameters;
  unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_> manifest;
  string filename;
  ManifestLoader loader;
  StringRef local_108;
  LoadManifestActions actions;
  SmallString<128U> current_dir;
  string workingDirectory;
  
  uVar33 = (undefined4)CONCAT71(in_register_00000031,loadOnly);
  pbVar34 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar31 = false;
  while (((pFVar11 = _stderr,
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish, pbVar21 = pbVar34, pbVar34 != pbVar2
          && (pbVar21 = pbVar2, pbVar34->_M_string_length != 0)) &&
         (*(pbVar34->_M_dataplus)._M_p == '-'))) {
    std::__cxx11::string::string((string *)&current_dir,(string *)pbVar34);
    bVar17 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &current_dir,"--json");
    pFVar11 = _stderr;
    bVar16 = true;
    if (!bVar17) {
      pcVar20 = llbuild::commands::getProgramName();
      fprintf(pFVar11,"error: %s: unknown option: \'%s\'\n",pcVar20,
              current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.BeginX);
      bVar16 = bVar31;
    }
    bVar31 = bVar16;
    std::__cxx11::string::_M_dispose();
    if (!bVar17) {
      return 1;
    }
    pbVar34 = pbVar34 + 1;
  }
  if (pbVar34 == pbVar21) {
    pcVar20 = llbuild::commands::getProgramName();
    fprintf(pFVar11,"error: %s: invalid number of arguments\n",pcVar20);
    return 1;
  }
  std::__cxx11::string::string((string *)&filename,(string *)pbVar34);
  pFVar11 = _stderr;
  if (pbVar34 + 1 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    lVar22 = std::__cxx11::string::rfind((char)&filename,0x2f);
    if (lVar22 != -1) {
      std::__cxx11::string::substr((ulong)&current_dir,(ulong)&filename);
      iVar18 = llbuild::basic::sys::chdir
                         ((char *)current_dir.super_SmallVector<char,_128U>.
                                  super_SmallVectorImpl<char>.
                                  super_SmallVectorTemplateBase<char,_true>.
                                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                  BeginX);
      std::__cxx11::string::_M_dispose();
      pFVar11 = _stderr;
      if ((char)iVar18 == '\0') {
        pcVar20 = llbuild::commands::getProgramName();
        piVar27 = __errno_location();
        llbuild::basic::sys::strerror_abi_cxx11_((sys *)&current_dir,*piVar27);
        fprintf(pFVar11,"error: %s: unable to chdir(): %s\n",pcVar20,
                current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
        std::__cxx11::string::_M_dispose();
        goto LAB_0011de23;
      }
      std::__cxx11::string::substr((ulong)&current_dir,(ulong)&filename);
      std::__cxx11::string::operator=((string *)&filename,(string *)&current_dir);
      std::__cxx11::string::_M_dispose();
    }
    current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX =
         &current_dir.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>;
    current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x80;
    eVar42 = llvm::sys::fs::current_path((SmallVectorImpl<char> *)&current_dir);
    pFVar11 = _stderr;
    if (eVar42._M_value == 0) {
      SStack_190.Ptr =
           (StringMapEntryBase **)
           (current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase._8_8_ & 0xffffffff);
      __begin2.
      super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
      .Ptr = (StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
              )(StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                )current_dir.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      llvm::StringRef::str_abi_cxx11_(&workingDirectory,(StringRef *)&__begin2);
      actions.super_ManifestLoaderActions._vptr_ManifestLoaderActions =
           (_func_int **)&PTR__ManifestLoaderActions_00201808;
      actions.Loader = (ManifestLoader *)0x0;
      actions.NumErrors = 0;
      actions.MaxErrors = 0x14;
      filename_00.Length = filename._M_string_length;
      filename_00.Data = filename._M_dataplus._M_p;
      llbuild::ninja::ManifestLoader::ManifestLoader
                (&loader,(StringRef)workingDirectory._0_16_,filename_00,
                 &actions.super_ManifestLoaderActions);
      llbuild::ninja::ManifestLoader::load((ManifestLoader *)&manifest);
      if ((char)uVar33 == '\0') {
        if (bVar31) {
          local_108.Data = filename._M_dataplus._M_p;
          local_108.Length = filename._M_string_length;
          std::operator<<((ostream *)&std::cout,"{\n");
          poVar23 = std::operator<<((ostream *)&std::cout,"  \"filename\": \"");
          llbuild::basic::escapeForJSON<llvm::StringRef>((string *)&__begin2,&local_108);
          poVar23 = std::operator<<(poVar23,(string *)&__begin2);
          std::operator<<(poVar23,"\",\n");
          std::__cxx11::string::_M_dispose();
          if (*(long *)((long)manifest._M_t.
                              super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                              .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                       + 0x68) != 0) {
            __assert_fail("manifest->getRootScope().getParent() == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaCommand.cpp"
                          ,0x263,"void dumpNinjaManifestJSON(StringRef, ninja::Manifest *)");
          }
          bindings.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          bindings.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          bindings.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          rules.super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)llvm::
                        StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
                        ::begin((StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
                                 *)((long)manifest._M_t.
                                          super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                          .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                          _M_head_impl + 0x70));
          uVar19 = *(uint *)((long)manifest._M_t.
                                   super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                   .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                   _M_head_impl + 0x78);
          lVar22 = *(long *)((long)manifest._M_t.
                                   super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                   .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                   _M_head_impl + 0x70);
          while (rules.
                 super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)((ulong)uVar19 * 8 + lVar22))
          {
            pRVar3 = *rules.
                      super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            commands.
            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&(pRVar3->parameters).super_StringMapImpl.NumBuckets;
            commands.
            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pRVar3->name)._M_dataplus._M_p;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<llvm::StringRef,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&__begin2,(StringRef *)&commands,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &(pRVar3->name)._M_string_length);
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)&bindings,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&__begin2);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__begin2);
            llvm::
            StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator++((StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&rules);
          }
          std::
          __sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (bindings.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     bindings.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::operator<<((ostream *)&std::cout,"  \"bindings\": {\n");
          ppVar14 = bindings.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar37 = bindings.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar37 != ppVar14;
              ppVar37 = ppVar37 + 1) {
            if (ppVar37 !=
                bindings.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              std::operator<<((ostream *)&std::cout,",\n");
            }
            poVar23 = std::operator<<((ostream *)&std::cout,"    \"");
            llbuild::basic::escapeForJSON<std::__cxx11::string>
                      ((string *)&__begin2,(basic *)ppVar37,in);
            poVar23 = std::operator<<(poVar23,(string *)&__begin2);
            poVar23 = std::operator<<(poVar23,"\": \"");
            llbuild::basic::escapeForJSON<std::__cxx11::string>
                      ((string *)&commands,(basic *)&ppVar37->second,in_00);
            poVar23 = std::operator<<(poVar23,(string *)&commands);
            std::operator<<(poVar23,"\"");
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
          }
          std::operator<<((ostream *)&std::cout,"\n  },\n");
          if (*(int *)((long)manifest._M_t.
                             super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                             .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                      + 0xf4) != 0) {
            commands.
            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            commands.
            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            commands.
            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            __begin2 = llvm::StringMap<llbuild::ninja::Pool_*,_llvm::MallocAllocator>::begin
                                 ((StringMap<llbuild::ninja::Pool_*,_llvm::MallocAllocator> *)
                                  ((long)manifest._M_t.
                                         super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                         .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                         _M_head_impl + 0xe8));
            uVar19 = *(uint *)((long)manifest._M_t.
                                     super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                     .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                     _M_head_impl + 0xf0);
            lVar22 = *(long *)((long)manifest._M_t.
                                     super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                     .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                     _M_head_impl + 0xe8);
            while (ppCVar26 = commands.
                              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                  ppCVar13 = commands.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  __begin2.
                  super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                  .Ptr != (StringMapEntryBase **)((ulong)uVar19 * 8 + lVar22)) {
              std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::
              push_back((vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *)
                        &commands,
                        (value_type *)
                        (*(long *)__begin2.
                                  super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                                  .Ptr + 8));
              llvm::
              StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
              ::operator++(&__begin2.
                            super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                          );
            }
            if (commands.
                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                commands.
                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              lVar35 = (long)commands.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)commands.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              uVar24 = lVar35 >> 3;
              lVar22 = 0x3f;
              if (uVar24 != 0) {
                for (; uVar24 >> lVar22 == 0; lVar22 = lVar22 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                        (commands.
                         super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         commands.
                         super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e
                        );
              if (lVar35 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                          (ppCVar13,ppCVar26);
              }
              else {
                ppCVar41 = ppCVar13 + 0x10;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                          (ppCVar13,ppCVar41);
                for (; ppCVar41 != ppCVar26; ppCVar41 = ppCVar41 + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                            (ppCVar41);
                }
              }
            }
            std::operator<<((ostream *)&std::cout,"  \"pools\": {\n");
            ppCVar13 = commands.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            for (ppCVar26 = commands.
                            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppCVar26 != ppCVar13;
                ppCVar26 = ppCVar26 + 1) {
              pCVar4 = *ppCVar26;
              if (ppCVar26 !=
                  commands.
                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                std::operator<<((ostream *)&std::cout,",\n");
              }
              poVar23 = std::operator<<((ostream *)&std::cout,"    \"");
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&__begin2,(basic *)pCVar4,in_01);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              std::operator<<(poVar23,"\": {");
              std::__cxx11::string::_M_dispose();
              if (*(int *)&(pCVar4->outputs).
                           super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
                poVar23 = std::operator<<((ostream *)&std::cout,"\n      \"depth\": ");
                std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
              }
              std::operator<<((ostream *)&std::cout,"\n    }");
            }
            std::operator<<((ostream *)&std::cout,"\n  },\n");
            std::_Vector_base<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::
            ~_Vector_base((_Vector_base<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>
                           *)&commands);
          }
          rules.super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          rules.super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          rules.super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __begin2.
          super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
          .Ptr = (StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                  )llvm::StringMap<llbuild::ninja::Rule_*,_llvm::MallocAllocator>::begin
                             ((StringMap<llbuild::ninja::Rule_*,_llvm::MallocAllocator> *)
                              ((long)manifest._M_t.
                                     super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                     .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                     _M_head_impl + 0x90));
          uVar19 = *(uint *)((long)manifest._M_t.
                                   super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                   .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                   _M_head_impl + 0x98);
          lVar22 = *(long *)((long)manifest._M_t.
                                   super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                   .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                   _M_head_impl + 0x90);
          while (ppRVar25 = rules.
                            super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                ppRVar12 = rules.
                           super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                __begin2.
                super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                .Ptr != (StringMapEntryBase **)((ulong)uVar19 * 8 + lVar22)) {
            std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::push_back
                      (&rules,(value_type *)
                              (*(long *)__begin2.
                                        super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                                        .Ptr + 8));
            llvm::
            StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_>
            ::operator++((StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_>
                          *)&__begin2);
          }
          if (rules.
              super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              rules.
              super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            lVar35 = (long)rules.
                           super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)rules.
                           super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar24 = lVar35 >> 3;
            lVar22 = 0x3f;
            if (uVar24 != 0) {
              for (; uVar24 >> lVar22 == 0; lVar22 = lVar22 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                      (rules.
                       super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       rules.
                       super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar35 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                        (ppRVar12,ppRVar25);
            }
            else {
              ppRVar38 = ppRVar12 + 0x10;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                        (ppRVar12,ppRVar38);
              for (; ppRVar38 != ppRVar25; ppRVar38 = ppRVar38 + 1) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                          (ppRVar38);
              }
            }
          }
          std::operator<<((ostream *)&std::cout,"  \"rules\": {\n");
          ppRVar12 = rules.
                     super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          ppRVar25 = rules.
                     super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          while (ppRVar25 != ppRVar12) {
            pRVar3 = *ppRVar25;
            uVar33 = SUB84(ppRVar25,0);
            uVar43 = (undefined4)((ulong)ppRVar25 >> 0x20);
            if (ppRVar25 !=
                rules.
                super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              std::operator<<((ostream *)&std::cout,",\n");
            }
            poVar23 = std::operator<<((ostream *)&std::cout,"    \"");
            llbuild::basic::escapeForJSON<std::__cxx11::string>
                      ((string *)&__begin2,(basic *)pRVar3,in_02);
            poVar23 = std::operator<<(poVar23,(string *)&__begin2);
            std::operator<<(poVar23,"\": {\n");
            std::__cxx11::string::_M_dispose();
            parameters.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            parameters.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            parameters.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            __begin2_1 = llvm::
                         StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
                         ::begin(&pRVar3->parameters);
            uVar19 = (pRVar3->parameters).super_StringMapImpl.NumBuckets;
            ppSVar40 = (pRVar3->parameters).super_StringMapImpl.TheTable;
            while (__begin2_1.
                   super_StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .Ptr != (StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )(ppSVar40 + uVar19)) {
              puVar5 = *(undefined8 **)
                        __begin2_1.
                        super_StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .Ptr;
              commands.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)(puVar5 + 5);
              commands.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar5;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<llvm::StringRef,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&__begin2,(StringRef *)&commands,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (puVar5 + 1));
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&parameters,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&__begin2);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&__begin2);
              llvm::
              StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator++(&__begin2_1.
                            super_StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          );
            }
            std::
            __sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (parameters.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       parameters.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            ppVar14 = parameters.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar37 = parameters.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppVar37 != ppVar14;
                ppVar37 = ppVar37 + 1) {
              if (ppVar37 !=
                  parameters.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                std::operator<<((ostream *)&std::cout,",\n");
              }
              poVar23 = std::operator<<((ostream *)&std::cout,"      \"");
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&__begin2,(basic *)ppVar37,in_03);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              poVar23 = std::operator<<(poVar23,"\": \"");
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&commands,(basic *)&ppVar37->second,in_04);
              poVar23 = std::operator<<(poVar23,(string *)&commands);
              std::operator<<(poVar23,"\"");
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            std::operator<<((ostream *)&std::cout,"\n    }");
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&parameters);
            ppRVar25 = (pointer)(CONCAT44(uVar43,uVar33) + 8);
          }
          std::operator<<((ostream *)&std::cout,"\n  },\n");
          if (*(long *)((long)manifest._M_t.
                              super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                              .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                       + 0x108) !=
              *(long *)((long)manifest._M_t.
                              super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                              .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                       + 0x110)) {
            std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::vector
                      ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       &commands,
                       (vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       ((long)manifest._M_t.
                              super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                              .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                       + 0x108));
            ppCVar26 = commands.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            ppCVar13 = commands.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if (commands.
                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                commands.
                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              lVar35 = (long)commands.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)commands.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              uVar24 = lVar35 >> 3;
              lVar22 = 0x3f;
              if (uVar24 != 0) {
                for (; uVar24 >> lVar22 == 0; lVar22 = lVar22 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                        (commands.
                         super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         commands.
                         super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e
                        );
              if (lVar35 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                          (ppCVar13,ppCVar26);
              }
              else {
                ppCVar41 = ppCVar13 + 0x10;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                          (ppCVar13,ppCVar41);
                for (; ppCVar41 != ppCVar26; ppCVar41 = ppCVar41 + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                            (ppCVar41);
                }
              }
            }
            std::operator<<((ostream *)&std::cout,"  \"default_targets\": [");
            ppCVar13 = commands.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            for (ppCVar26 = commands.
                            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppCVar26 != ppCVar13;
                ppCVar26 = ppCVar26 + 1) {
              if (ppCVar26 !=
                  commands.
                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                std::operator<<((ostream *)&std::cout,", ");
              }
              poVar23 = std::operator<<((ostream *)&std::cout,"\"");
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&__begin2,
                         (basic *)&((*ppCVar26)->outputs).
                                   super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,in_05);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              std::operator<<(poVar23,"\"");
              std::__cxx11::string::_M_dispose();
            }
            std::operator<<((ostream *)&std::cout,"],\n");
            std::_Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::
            ~_Vector_base((_Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                           *)&commands);
          }
          std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::vector
                    (&commands,
                     (vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                      *)((long)manifest._M_t.
                               super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                               .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                               _M_head_impl + 0xd0));
          ppCVar26 = commands.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          ppCVar13 = commands.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (commands.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              commands.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            lVar35 = (long)commands.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)commands.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar24 = lVar35 >> 3;
            lVar22 = 0x3f;
            if (uVar24 != 0) {
              for (; uVar24 >> lVar22 == 0; lVar22 = lVar22 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                      (commands.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       commands.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar35 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                        (ppCVar13,ppCVar26);
            }
            else {
              ppCVar41 = ppCVar13 + 0x10;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                        (ppCVar13,ppCVar41);
              for (; ppCVar41 != ppCVar26; ppCVar41 = ppCVar41 + 1) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                          (ppCVar41);
              }
            }
          }
          std::operator<<((ostream *)&std::cout,"  \"commands\": [\n");
          ppCVar13 = commands.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          ppCVar26 = commands.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          while (ppCVar26 != ppCVar13) {
            pCVar4 = *ppCVar26;
            uVar33 = SUB84(ppCVar26,0);
            uVar43 = (undefined4)((ulong)ppCVar26 >> 0x20);
            if (ppCVar26 !=
                commands.
                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              std::operator<<((ostream *)&std::cout,",\n");
            }
            std::operator<<((ostream *)&std::cout,"    {\n");
            std::operator<<((ostream *)&std::cout,"      \"outputs\": [");
            ppNVar9 = (pCVar4->outputs).
                      super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppNVar30 = (pCVar4->outputs).
                            super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppNVar30 != ppNVar9;
                ppNVar30 = ppNVar30 + 1) {
              if (ppNVar30 !=
                  (pCVar4->outputs).
                  super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                std::operator<<((ostream *)&std::cout,", ");
              }
              poVar23 = std::operator<<((ostream *)&std::cout,"\"");
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&__begin2,(basic *)&(*ppNVar30)->screenPath,in_06);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              std::operator<<(poVar23,"\"");
              std::__cxx11::string::_M_dispose();
            }
            std::operator<<((ostream *)&std::cout,"],\n");
            poVar23 = std::operator<<((ostream *)&std::cout,"      \"rule\": \"");
            poVar23 = std::operator<<(poVar23,(string *)pCVar4->rule);
            std::operator<<(poVar23,"\",\n");
            std::operator<<((ostream *)&std::cout,"      \"inputs\": [");
            ppNVar30 = (pCVar4->inputs).
                       super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            for (lVar22 = (ulong)pCVar4->numExplicitInputs << 3; lVar22 != 0; lVar22 = lVar22 + -8)
            {
              if (ppNVar30 !=
                  (pCVar4->inputs).
                  super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                std::operator<<((ostream *)&std::cout,", ");
              }
              poVar23 = std::operator<<((ostream *)&std::cout,"\"");
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&__begin2,(basic *)&(*ppNVar30)->screenPath,in_07);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              std::operator<<(poVar23,"\"");
              std::__cxx11::string::_M_dispose();
              ppNVar30 = ppNVar30 + 1;
            }
            std::operator<<((ostream *)&std::cout,"],\n");
            if (pCVar4->numImplicitInputs != 0) {
              std::operator<<((ostream *)&std::cout,"      \"implicit_inputs\": [");
              ppNVar30 = (pCVar4->inputs).
                         super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + pCVar4->numExplicitInputs;
              for (lVar22 = (ulong)pCVar4->numImplicitInputs << 3; lVar22 != 0; lVar22 = lVar22 + -8
                  ) {
                if (ppNVar30 !=
                    (pCVar4->inputs).
                    super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + pCVar4->numExplicitInputs) {
                  std::operator<<((ostream *)&std::cout,", ");
                }
                poVar23 = std::operator<<((ostream *)&std::cout,"\"");
                llbuild::basic::escapeForJSON<std::__cxx11::string>
                          ((string *)&__begin2,(basic *)&(*ppNVar30)->screenPath,in_08);
                poVar23 = std::operator<<(poVar23,(string *)&__begin2);
                std::operator<<(poVar23,"\"");
                std::__cxx11::string::_M_dispose();
                ppNVar30 = ppNVar30 + 1;
              }
              std::operator<<((ostream *)&std::cout,"],\n");
            }
            uVar19 = llbuild::ninja::Command::getNumOrderOnlyInputs(pCVar4);
            if (uVar19 != 0) {
              std::operator<<((ostream *)&std::cout,"      \"order_only_inputs\": [");
              ppNVar9 = (pCVar4->inputs).
                        super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (ppNVar30 = (pCVar4->inputs).
                              super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                              (ulong)pCVar4->numExplicitInputs + (ulong)pCVar4->numImplicitInputs;
                  ppNVar30 != ppNVar9; ppNVar30 = ppNVar30 + 1) {
                if (ppNVar30 !=
                    (pCVar4->inputs).
                    super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    (ulong)pCVar4->numExplicitInputs + (ulong)pCVar4->numImplicitInputs) {
                  std::operator<<((ostream *)&std::cout,", ");
                }
                poVar23 = std::operator<<((ostream *)&std::cout,"\"");
                llbuild::basic::escapeForJSON<std::__cxx11::string>
                          ((string *)&__begin2,(basic *)&(*ppNVar30)->screenPath,in_09);
                poVar23 = std::operator<<(poVar23,(string *)&__begin2);
                std::operator<<(poVar23,"\"");
                std::__cxx11::string::_M_dispose();
              }
              std::operator<<((ostream *)&std::cout,"],\n");
            }
            bVar28 = pCVar4->field_0x110;
            if ((bVar28 & 4) != 0) {
              std::operator<<((ostream *)&std::cout,"      \"generator\": true,\n");
              bVar28 = pCVar4->field_0x110;
            }
            if ((bVar28 & 8) != 0) {
              std::operator<<((ostream *)&std::cout,"      \"restat\": true,\n");
            }
            this = pCVar4->executionPool;
            if (this != (Pool *)0x0) {
              poVar23 = std::operator<<((ostream *)&std::cout,"      \"pool\": \"");
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&__begin2,(basic *)this,in_10);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              std::operator<<(poVar23,"\",\n");
              std::__cxx11::string::_M_dispose();
            }
            bVar28 = pCVar4->field_0x110 & 3;
            if (bVar28 == 2) {
              std::operator<<((ostream *)&std::cout,"      \"deps\": \"msvc\",\n");
            }
            else if (bVar28 == 1) {
              std::operator<<((ostream *)&std::cout,"      \"deps\": \"gcc\",\n");
              poVar23 = std::operator<<((ostream *)&std::cout,"      \"depfile\": \"");
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&__begin2,(basic *)&pCVar4->depsFile,in_11);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              std::operator<<(poVar23,"\",\n");
              std::__cxx11::string::_M_dispose();
            }
            poVar23 = std::operator<<((ostream *)&std::cout,"      \"command\": \"");
            llbuild::basic::escapeForJSON<std::__cxx11::string>
                      ((string *)&__begin2,(basic *)&pCVar4->commandString,in_12);
            poVar23 = std::operator<<(poVar23,(string *)&__begin2);
            std::operator<<(poVar23,"\",\n");
            std::__cxx11::string::_M_dispose();
            poVar23 = std::operator<<((ostream *)&std::cout,"      \"description\": \"");
            llbuild::basic::escapeForJSON<std::__cxx11::string>
                      ((string *)&__begin2,(basic *)&pCVar4->description,in_13);
            poVar23 = std::operator<<(poVar23,(string *)&__begin2);
            std::operator<<(poVar23,"\"\n");
            std::__cxx11::string::_M_dispose();
            std::operator<<((ostream *)&std::cout,"    }");
            ppCVar26 = (pointer)(CONCAT44(uVar43,uVar33) + 8);
          }
          std::operator<<((ostream *)&std::cout,"\n  ]\n");
          std::operator<<((ostream *)&std::cout,"}\n");
          std::_Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::
          ~_Vector_base(&commands.
                         super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       );
          std::_Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::
          ~_Vector_base(&rules.
                         super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                       );
          this_00 = (vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> *
                    )&bindings;
        }
        else {
          parameters.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)filename._M_dataplus._M_p;
          parameters.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)filename._M_string_length;
          poVar23 = std::operator<<((ostream *)&std::cout,"# Loaded Manifest: \"");
          llvm::StringRef::str_abi_cxx11_((string *)&__begin2,(StringRef *)&parameters);
          poVar23 = std::operator<<(poVar23,(string *)&__begin2);
          std::operator<<(poVar23,"\"\n");
          std::__cxx11::string::_M_dispose();
          std::operator<<((ostream *)&std::cout,"\n");
          std::operator<<((ostream *)&std::cout,"# Top-Level Bindings\n");
          if (*(long *)((long)manifest._M_t.
                              super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                              .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                       + 0x68) != 0) {
            __assert_fail("manifest->getRootScope().getParent() == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaCommand.cpp"
                          ,0x1d4,"void dumpNinjaManifestText(StringRef, ninja::Manifest *)");
          }
          commands.
          super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          commands.
          super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          commands.
          super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          rules.super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)llvm::
                        StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
                        ::begin((StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
                                 *)((long)manifest._M_t.
                                          super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                          .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                          _M_head_impl + 0x70));
          uVar19 = *(uint *)((long)manifest._M_t.
                                   super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                   .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                   _M_head_impl + 0x78);
          lVar22 = *(long *)((long)manifest._M_t.
                                   super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                   .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                   _M_head_impl + 0x70);
          while (rules.
                 super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)((ulong)uVar19 * 8 + lVar22))
          {
            pRVar3 = *rules.
                      super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bindings.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&(pRVar3->parameters).super_StringMapImpl.NumBuckets;
            bindings.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pRVar3->name)._M_dataplus._M_p;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<llvm::StringRef,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&__begin2,(StringRef *)&bindings,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &(pRVar3->name)._M_string_length);
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)&commands,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&__begin2);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__begin2);
            llvm::
            StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator++((StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&rules);
          }
          std::
          __sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (commands.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     commands.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          ppCVar13 = commands.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar29 = (string *)
                         commands.
                         super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar29 != (string *)ppCVar13;
              psVar29 = psVar29 + 0x40) {
            poVar23 = std::operator<<((ostream *)&std::cout,psVar29);
            poVar23 = std::operator<<(poVar23," = \"");
            str.Length._0_4_ = uVar33;
            str.Data = (char *)in_stack_fffffffffffffde8;
            str.Length._4_4_ = in_stack_fffffffffffffdf4;
            llbuild::commands::util::escapedString_abi_cxx11_(str);
            poVar23 = std::operator<<(poVar23,(string *)&__begin2);
            std::operator<<(poVar23,"\"\n");
            std::__cxx11::string::_M_dispose();
          }
          std::operator<<((ostream *)&std::cout,"\n");
          if (*(int *)((long)manifest._M_t.
                             super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                             .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                      + 0xf4) != 0) {
            std::operator<<((ostream *)&std::cout,"# Pools\n");
            __begin2.
            super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
            .Ptr = (StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                    )(StringMapEntryBase **)0x0;
            SStack_190.Ptr = (StringMapEntryBase **)0x0;
            bindings.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)llvm::StringMap<llbuild::ninja::Pool_*,_llvm::MallocAllocator>::begin
                                    ((StringMap<llbuild::ninja::Pool_*,_llvm::MallocAllocator> *)
                                     ((long)manifest._M_t.
                                            super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                            .
                                            super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>
                                            ._M_head_impl + 0xe8));
            uVar19 = *(uint *)((long)manifest._M_t.
                                     super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                     .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                     _M_head_impl + 0xf0);
            lVar22 = *(long *)((long)manifest._M_t.
                                     super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                     .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                     _M_head_impl + 0xe8);
            while (iVar15.
                   super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                   .Ptr = __begin2.
                          super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                          .Ptr,
                  bindings.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)((ulong)uVar19 * 8 + lVar22)
                  ) {
              std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::
              push_back((vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *)
                        &__begin2,
                        (value_type *)
                        (((bindings.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p + 8))
              ;
              llvm::
              StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
              ::operator++((StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                            *)&bindings);
            }
            SVar32 = __begin2.
                     super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                     .Ptr;
            if (__begin2.
                super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                .Ptr != (StringMapEntryBase **)0x0) {
              lVar35 = -(long)__begin2.
                              super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                              .Ptr;
              uVar24 = lVar35 >> 3;
              lVar22 = 0x3f;
              if (uVar24 != 0) {
                for (; uVar24 >> lVar22 == 0; lVar22 = lVar22 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                        (__begin2.
                         super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                         .Ptr,0,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
              if (lVar35 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                          (iVar15.
                           super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                           .Ptr,0);
                SVar32 = __begin2.
                         super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                         .Ptr;
              }
              else {
                lVar22 = (long)iVar15.
                               super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                               .Ptr + 0x80;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                          (iVar15.
                           super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                           .Ptr,lVar22);
                for (; SVar32 = __begin2.
                                super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                                .Ptr, lVar22 != 0; lVar22 = lVar22 + 8) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                            (lVar22);
                }
              }
            }
            for (; SVar32.Ptr != (StringMapEntryBase **)0x0; SVar32.Ptr = SVar32.Ptr + 1) {
              poVar23 = std::operator<<((ostream *)&std::cout,"pool ");
              poVar23 = std::operator<<(poVar23,(string *)*SVar32.Ptr);
              std::operator<<(poVar23,"\n");
              if ((int)(*SVar32.Ptr)[4].StrLen != 0) {
                poVar23 = std::operator<<((ostream *)&std::cout,"  depth = ");
                poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
                std::operator<<(poVar23,"\n");
              }
              std::operator<<((ostream *)&std::cout,"\n");
            }
            std::_Vector_base<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::
            ~_Vector_base((_Vector_base<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>
                           *)&__begin2);
          }
          std::operator<<((ostream *)&std::cout,"# Rules\n");
          bindings.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          bindings.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          bindings.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __begin2.
          super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
          .Ptr = (StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                  )llvm::StringMap<llbuild::ninja::Rule_*,_llvm::MallocAllocator>::begin
                             ((StringMap<llbuild::ninja::Rule_*,_llvm::MallocAllocator> *)
                              ((long)manifest._M_t.
                                     super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                     .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                     _M_head_impl + 0x90));
          uVar19 = *(uint *)((long)manifest._M_t.
                                   super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                   .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                   _M_head_impl + 0x98);
          lVar22 = *(long *)((long)manifest._M_t.
                                   super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                   .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                   _M_head_impl + 0x90);
          while (ppVar37 = bindings.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                ppVar14 = bindings.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                __begin2.
                super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                .Ptr != (StringMapEntryBase **)((ulong)uVar19 * 8 + lVar22)) {
            std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::push_back
                      ((vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> *)
                       &bindings,
                       (value_type *)
                       (*(long *)__begin2.
                                 super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                                 .Ptr + 8));
            llvm::
            StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_>
            ::operator++((StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_>
                          *)&__begin2);
          }
          if (bindings.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              bindings.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            lVar35 = (long)bindings.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)bindings.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar24 = lVar35 >> 3;
            lVar22 = 0x3f;
            if (uVar24 != 0) {
              for (; uVar24 >> lVar22 == 0; lVar22 = lVar22 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                      (bindings.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       bindings.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar35 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                        (ppVar14,ppVar37);
            }
            else {
              ppVar36 = ppVar14 + 2;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                        (ppVar14,ppVar36);
              for (; ppVar36 != ppVar37; ppVar36 = (pointer)&(ppVar36->first)._M_string_length) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                          (ppVar36);
              }
            }
          }
          ppVar14 = bindings.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppVar37 = bindings.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          while (ppVar37 != ppVar14) {
            poVar23 = std::operator<<((ostream *)&std::cout,"rule ");
            poVar23 = std::operator<<(poVar23,(string *)(ppVar37->first)._M_dataplus._M_p);
            std::operator<<(poVar23,"\n");
            rules.
            super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            rules.
            super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            rules.
            super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            uVar33 = SUB84(ppVar37,0);
            in_stack_fffffffffffffdf4 = (undefined4)((ulong)ppVar37 >> 0x20);
            pcVar6 = (ppVar37->first)._M_dataplus._M_p;
            __begin2_1 = llvm::
                         StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
                         ::begin((StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
                                  *)(pcVar6 + 0x20));
            uVar19 = *(uint *)(pcVar6 + 0x28);
            lVar22 = *(long *)(pcVar6 + 0x20);
            while (__begin2_1.
                   super_StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .Ptr != (StringMapEntryBase **)((ulong)uVar19 * 8 + lVar22)) {
              psVar7 = *(size_type **)
                        __begin2_1.
                        super_StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .Ptr;
              local_108.Data = (char *)(psVar7 + 5);
              local_108.Length = *psVar7;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<llvm::StringRef,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&__begin2,&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar7 + 1));
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&rules,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&__begin2);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&__begin2);
              llvm::
              StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator++(&__begin2_1.
                            super_StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          );
            }
            std::
            __sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (rules.
                       super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       rules.
                       super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            ppRVar12 = rules.
                       super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            for (psVar29 = (string *)
                           rules.
                           super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                           ._M_impl.super__Vector_impl_data._M_start; psVar29 != (string *)ppRVar12;
                psVar29 = psVar29 + 0x40) {
              poVar23 = std::operator<<((ostream *)&std::cout,"  ");
              poVar23 = std::operator<<(poVar23,psVar29);
              poVar23 = std::operator<<(poVar23," = \"");
              str_00.Length._0_4_ = uVar33;
              str_00.Data = (char *)in_stack_fffffffffffffde8;
              str_00.Length._4_4_ = in_stack_fffffffffffffdf4;
              llbuild::commands::util::escapedString_abi_cxx11_(str_00);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              std::operator<<(poVar23,"\"\n");
              std::__cxx11::string::_M_dispose();
            }
            std::operator<<((ostream *)&std::cout,"\n");
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&rules);
            ppVar37 = (pointer)(CONCAT44(in_stack_fffffffffffffdf4,uVar33) + 8);
          }
          std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::vector
                    ((vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                      *)&rules,
                     (vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                      *)((long)manifest._M_t.
                               super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                               .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                               _M_head_impl + 0xd0));
          ppRVar25 = rules.
                     super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          ppRVar12 = rules.
                     super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (rules.
              super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              rules.
              super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            lVar35 = (long)rules.
                           super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)rules.
                           super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar24 = lVar35 >> 3;
            lVar22 = 0x3f;
            if (uVar24 != 0) {
              for (; uVar24 >> lVar22 == 0; lVar22 = lVar22 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                      (rules.
                       super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       rules.
                       super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar35 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                        (ppRVar12,ppRVar25);
            }
            else {
              ppRVar38 = ppRVar12 + 0x10;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                        (ppRVar12,ppRVar38);
              for (; ppRVar38 != ppRVar25; ppRVar38 = ppRVar38 + 1) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                          (ppRVar38);
              }
            }
          }
          std::operator<<((ostream *)&std::cout,"# Commands\n");
          ppRVar12 = rules.
                     super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          ppRVar25 = rules.
                     super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          while (ppRVar25 != ppRVar12) {
            std::operator<<((ostream *)&std::cout,"build");
            sVar8 = *(size_type *)((long)&((*ppRVar25)->name).field_2 + 8);
            for (sVar39 = ((*ppRVar25)->name).field_2._M_allocated_capacity; sVar39 != sVar8;
                sVar39 = sVar39 + 8) {
              poVar23 = std::operator<<((ostream *)&std::cout," \"");
              str_01.Length._0_4_ = uVar33;
              str_01.Data = (char *)in_stack_fffffffffffffde8;
              str_01.Length._4_4_ = in_stack_fffffffffffffdf4;
              llbuild::commands::util::escapedString_abi_cxx11_(str_01);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              std::operator<<(poVar23,"\"");
              std::__cxx11::string::_M_dispose();
            }
            poVar23 = std::operator<<((ostream *)&std::cout,": ");
            std::operator<<(poVar23,(string *)((*ppRVar25)->name)._M_string_length);
            uVar33 = SUB84(ppRVar25,0);
            in_stack_fffffffffffffdf4 = (undefined4)((ulong)ppRVar25 >> 0x20);
            pRVar3 = *ppRVar25;
            lVar22._0_4_ = (pRVar3->parameters).super_StringMapImpl.NumBuckets;
            lVar22._4_4_ = (pRVar3->parameters).super_StringMapImpl.NumItems;
            lVar35._0_4_ = (pRVar3->parameters).super_StringMapImpl.NumTombstones;
            lVar35._4_4_ = (pRVar3->parameters).super_StringMapImpl.ItemSize;
            iVar18 = 0;
            for (; lVar22 != lVar35; lVar22 = lVar22 + 8) {
              std::operator<<((ostream *)&std::cout," ");
              iVar1 = *(int *)(*(long *)CONCAT44(in_stack_fffffffffffffdf4,uVar33) + 0x40);
              pcVar20 = "|| ";
              if ((iVar18 == *(int *)(*(long *)CONCAT44(in_stack_fffffffffffffdf4,uVar33) + 0x44) +
                             iVar1) || (pcVar20 = "| ", iVar18 == iVar1)) {
                std::operator<<((ostream *)&std::cout,pcVar20);
              }
              poVar23 = std::operator<<((ostream *)&std::cout,"\"");
              str_02.Length._0_4_ = uVar33;
              str_02.Data = (char *)in_stack_fffffffffffffde8;
              str_02.Length._4_4_ = in_stack_fffffffffffffdf4;
              llbuild::commands::util::escapedString_abi_cxx11_(str_02);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              std::operator<<(poVar23,"\"");
              std::__cxx11::string::_M_dispose();
              iVar18 = iVar18 + 1;
            }
            std::operator<<((ostream *)&std::cout,"\n");
            poVar23 = std::operator<<((ostream *)&std::cout,"  command = \"");
            plVar10 = (long *)CONCAT44(in_stack_fffffffffffffdf4,uVar33);
            str_03.Length._0_4_ = uVar33;
            str_03.Data = (char *)in_stack_fffffffffffffde8;
            str_03.Length._4_4_ = in_stack_fffffffffffffdf4;
            llbuild::commands::util::escapedString_abi_cxx11_(str_03);
            poVar23 = std::operator<<(poVar23,(string *)&__begin2);
            std::operator<<(poVar23,"\"\n");
            std::__cxx11::string::_M_dispose();
            poVar23 = std::operator<<((ostream *)&std::cout,"  description = \"");
            str_04.Length._0_4_ = uVar33;
            str_04.Data = (char *)in_stack_fffffffffffffde8;
            str_04.Length._4_4_ = in_stack_fffffffffffffdf4;
            llbuild::commands::util::escapedString_abi_cxx11_(str_04);
            poVar23 = std::operator<<(poVar23,(string *)&__begin2);
            std::operator<<(poVar23,"\"\n");
            std::__cxx11::string::_M_dispose();
            bVar28 = *(byte *)(*plVar10 + 0x110) & 3;
            if (bVar28 == 1) {
              std::operator<<((ostream *)&std::cout,"  deps = gcc\n");
              poVar23 = std::operator<<((ostream *)&std::cout,"  depfile = \"");
              str_05.Length._0_4_ = uVar33;
              str_05.Data = (char *)in_stack_fffffffffffffde8;
              str_05.Length._4_4_ = in_stack_fffffffffffffdf4;
              llbuild::commands::util::escapedString_abi_cxx11_(str_05);
              poVar23 = std::operator<<(poVar23,(string *)&__begin2);
              std::operator<<(poVar23,"\"\n");
              std::__cxx11::string::_M_dispose();
            }
            else if (bVar28 == 2) {
              std::operator<<((ostream *)&std::cout,"  deps = msvc\n");
            }
            lVar22 = *plVar10;
            bVar28 = *(byte *)(lVar22 + 0x110);
            if ((bVar28 & 4) != 0) {
              std::operator<<((ostream *)&std::cout,"  generator = 1\n");
              lVar22 = *plVar10;
              bVar28 = *(byte *)(lVar22 + 0x110);
            }
            if ((bVar28 & 8) != 0) {
              std::operator<<((ostream *)&std::cout,"  restat = 1\n");
              lVar22 = *plVar10;
            }
            psVar29 = *(string **)(lVar22 + 0x68);
            if (psVar29 != (string *)0x0) {
              poVar23 = std::operator<<((ostream *)&std::cout,"  pool = ");
              poVar23 = std::operator<<(poVar23,psVar29);
              std::operator<<(poVar23,"\n");
            }
            std::operator<<((ostream *)&std::cout,"\n");
            ppRVar25 = (pointer)(plVar10 + 1);
          }
          if (*(long *)((long)manifest._M_t.
                              super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                              .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                       + 0x108) !=
              *(long *)((long)manifest._M_t.
                              super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                              .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                       + 0x110)) {
            std::operator<<((ostream *)&std::cout,"# Default Targets\n");
            std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::vector
                      ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       &__begin2,
                       (vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       ((long)manifest._M_t.
                              super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                              .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl
                       + 0x108));
            iVar15 = __begin2;
            if (__begin2.
                super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                .Ptr != (StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                         )SStack_190.Ptr) {
              lVar35 = (long)SStack_190.Ptr -
                       (long)__begin2.
                             super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                             .Ptr;
              uVar24 = lVar35 >> 3;
              lVar22 = 0x3f;
              if (uVar24 != 0) {
                for (; uVar24 >> lVar22 == 0; lVar22 = lVar22 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                        (__begin2.
                         super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                         .Ptr,SStack_190.Ptr,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
              if (lVar35 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                          (iVar15.
                           super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                           .Ptr,SStack_190.Ptr);
              }
              else {
                ppSVar40 = (StringMapEntryBase **)
                           ((long)iVar15.
                                  super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                                  .Ptr + 0x80);
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                          (iVar15.
                           super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                           .Ptr,ppSVar40);
                for (; ppSVar40 != SStack_190.Ptr; ppSVar40 = ppSVar40 + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                            (ppSVar40);
                }
              }
            }
            std::operator<<((ostream *)&std::cout,"default ");
            for (SVar32 = __begin2.
                          super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                          .Ptr; SVar32.Ptr != SStack_190.Ptr; SVar32.Ptr = SVar32.Ptr + 1) {
              if (*SVar32.Ptr !=
                  *(StringMapEntryBase **)
                   __begin2.
                   super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                   .Ptr) {
                std::operator<<((ostream *)&std::cout," ");
              }
              poVar23 = std::operator<<((ostream *)&std::cout,"\"");
              poVar23 = std::operator<<(poVar23,(string *)(*SVar32.Ptr + 4));
              std::operator<<(poVar23,"\"");
            }
            std::operator<<((ostream *)&std::cout,"\n\n");
            std::_Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::
            ~_Vector_base((_Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                           *)&__begin2);
          }
          std::_Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::
          ~_Vector_base((_Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                         *)&rules);
          std::_Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::
          ~_Vector_base((_Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                         *)&bindings);
          this_00 = &commands;
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this_00);
      }
      std::unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>::
      ~unique_ptr(&manifest);
      llbuild::ninja::ManifestLoader::~ManifestLoader(&loader);
      llbuild::ninja::ManifestLoaderActions::~ManifestLoaderActions
                (&actions.super_ManifestLoaderActions);
      std::__cxx11::string::_M_dispose();
      iVar18 = 0;
    }
    else {
      pcVar20 = llbuild::commands::getProgramName();
      fprintf(pFVar11,"%s: error: cannot determine current directory\n",pcVar20);
      iVar18 = 1;
    }
    llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&current_dir);
  }
  else {
    pcVar20 = llbuild::commands::getProgramName();
    fprintf(pFVar11,"error: %s: invalid number of arguments\n",pcVar20);
LAB_0011de23:
    iVar18 = 1;
  }
  std::__cxx11::string::_M_dispose();
  return iVar18;
}

Assistant:

static int executeLoadManifestCommand(const std::vector<std::string>& args,
                                      bool loadOnly) {
  // Parse options.
  bool json = false;
  auto it = args.begin();
  for (; it != args.end() && StringRef(*it).startswith("-"); ++it) {
    auto arg = *it;

    if (arg == "--json") {
      json = true;
    } else {
      fprintf(stderr, "error: %s: unknown option: '%s'\n",
              getProgramName(), arg.c_str());
      return 1;
    }
  }
  if (it == args.end()) {
    fprintf(stderr, "error: %s: invalid number of arguments\n",
            getProgramName());
    return 1;
  }

  std::string filename = *it++;
  if (it != args.end()) {
    fprintf(stderr, "error: %s: invalid number of arguments\n",
            getProgramName());
    return 1;
  }

  // Change to the directory containing the input file, so include references
  // can be relative.
  //
  // FIXME: Need llvm::sys::fs.
  size_t pos = filename.find_last_of('/');
  if (pos != std::string::npos) {
    if (!sys::chdir(filename.substr(0, pos).c_str())) {
      fprintf(stderr, "error: %s: unable to chdir(): %s\n",
              getProgramName(), sys::strerror(errno).c_str());
      return 1;
    }
    filename = filename.substr(pos+1);
  }

  SmallString<128> current_dir;
  if (std::error_code ec = llvm::sys::fs::current_path(current_dir)) {
    fprintf(stderr, "%s: error: cannot determine current directory\n",
            getProgramName());
    return 1;
  }
  const std::string workingDirectory = current_dir.str();

  LoadManifestActions actions;
  ninja::ManifestLoader loader(workingDirectory, filename, actions);
  std::unique_ptr<ninja::Manifest> manifest = loader.load();

  // If only loading, we are done.
  if (loadOnly)
    return 0;

  if (json) {
    dumpNinjaManifestJSON(filename, manifest.get());
  } else {
    dumpNinjaManifestText(filename, manifest.get());
  }

  return 0;
}